

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.hpp
# Opt level: O3

void __thiscall BCL::debug_error::debug_error(debug_error *this,string *what_arg)

{
  pointer pcVar1;
  
  (this->super_error).what_arg_._M_dataplus._M_p = (pointer)&(this->super_error).what_arg_.field_2;
  (this->super_error).what_arg_._M_string_length = 0;
  (this->super_error).what_arg_.field_2._M_local_buf[0] = '\0';
  (this->what_arg_)._M_dataplus._M_p = (pointer)&(this->what_arg_).field_2;
  pcVar1 = (what_arg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->what_arg_,pcVar1,pcVar1 + what_arg->_M_string_length);
  return;
}

Assistant:

debug_error(const std::string& what_arg) : what_arg_(what_arg) {}